

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicVector.hpp
# Opt level: O2

double OpenMD::dot<double>(DynamicVector<double,_std::allocator<double>_> *v1,
                          DynamicVector<double,_std::allocator<double>_> *v2)

{
  pointer pdVar1;
  long lVar2;
  double dVar3;
  
  pdVar1 = (v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  dVar3 = 0.0;
  for (lVar2 = 0;
      (long)(v1->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)pdVar1 >> 3 != lVar2; lVar2 = lVar2 + 1) {
    dVar3 = dVar3 + pdVar1[lVar2] *
                    (v2->data_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar2];
  }
  return dVar3;
}

Assistant:

inline Real dot(const DynamicVector<Real>& v1,
                  const DynamicVector<Real>& v2) {
    Real tmp;
    tmp = 0;
    assert(v1.size() == v2.size());
    for (typename DynamicVector<Real>::size_type i {}; i < v1.size(); i++)
      tmp += v1[i] * v2[i];

    return tmp;
  }